

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_high16_stage3_sse2(__m128i *x)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  
  alVar1 = x[0x10];
  alVar2 = x[0x12];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x11]);
  x[0x10] = alVar3;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x11]);
  x[0x11] = alVar1;
  alVar1 = (__m128i)psubsw((undefined1  [16])x[0x13],(undefined1  [16])alVar2);
  x[0x12] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0x13],(undefined1  [16])alVar2);
  x[0x13] = alVar1;
  alVar1 = x[0x14];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x15]);
  x[0x14] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x15]);
  x[0x15] = alVar1;
  alVar1 = x[0x16];
  alVar2 = (__m128i)psubsw((undefined1  [16])x[0x17],(undefined1  [16])alVar1);
  x[0x16] = alVar2;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0x17],(undefined1  [16])alVar1);
  x[0x17] = alVar1;
  alVar1 = x[0x18];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x19]);
  x[0x18] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x19]);
  x[0x19] = alVar1;
  alVar1 = x[0x1a];
  alVar2 = (__m128i)psubsw((undefined1  [16])x[0x1b],(undefined1  [16])alVar1);
  x[0x1a] = alVar2;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0x1b],(undefined1  [16])alVar1);
  x[0x1b] = alVar1;
  alVar1 = x[0x1c];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x1d]);
  x[0x1c] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x1d]);
  x[0x1d] = alVar1;
  alVar1 = x[0x1e];
  alVar2 = (__m128i)psubsw((undefined1  [16])x[0x1f],(undefined1  [16])alVar1);
  x[0x1e] = alVar2;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0x1f],(undefined1  [16])alVar1);
  x[0x1f] = alVar1;
  return;
}

Assistant:

static inline void idct32_high16_stage3_sse2(__m128i *x) {
  btf_16_adds_subs_sse2(x[16], x[17]);
  btf_16_subs_adds_sse2(x[19], x[18]);
  btf_16_adds_subs_sse2(x[20], x[21]);
  btf_16_subs_adds_sse2(x[23], x[22]);
  btf_16_adds_subs_sse2(x[24], x[25]);
  btf_16_subs_adds_sse2(x[27], x[26]);
  btf_16_adds_subs_sse2(x[28], x[29]);
  btf_16_subs_adds_sse2(x[31], x[30]);
}